

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp-mpiu.c
# Opt level: O2

int MPIU_GetLoc(void *base,MPI_Datatype type,MPI_Op op,MPI_Comm comm)

{
  int iVar1;
  void *__s2;
  int rank;
  int ret;
  int ThisTask;
  int NTask;
  ptrdiff_t elsize;
  ptrdiff_t lb;
  
  MPI_Type_get_extent(type,&lb,&elsize);
  __s2 = malloc(elsize);
  MPI_Allreduce(base,__s2,1,type,op,comm);
  MPI_Comm_size(comm,&NTask);
  MPI_Comm_rank(comm,&ThisTask);
  rank = NTask;
  ret = -1;
  iVar1 = bcmp(base,__s2,elsize);
  if (iVar1 == 0) {
    rank = ThisTask;
  }
  MPI_Allreduce(&rank,&ret,1,&ompi_mpi_int,&ompi_mpi_op_min,comm);
  free(__s2);
  return ret;
}

Assistant:

int
MPIU_GetLoc(const void * base, MPI_Datatype type, MPI_Op op, MPI_Comm comm)
{
    ptrdiff_t lb;
    ptrdiff_t elsize;
    MPI_Type_get_extent(type, &lb, &elsize);

    void * tmp = malloc(elsize);
    /* find the result of the reduction. */
    MPI_Allreduce(base, tmp, 1, type, op, comm);

    int ThisTask;
    int NTask;
    MPI_Comm_size(comm, &NTask);
    MPI_Comm_rank(comm, &ThisTask);
    int rank = NTask;
    int ret = -1;
    if (memcmp(base, tmp, elsize) == 0) {
        rank = ThisTask;
    }
    /* find the rank that is the same as the reduction result */
    /* avoid MPI_IN_PLACE, since if we are using this code, we have assumed we are using
     * a crazy MPI impl...
     * */
    MPI_Allreduce(&rank, &ret, 1, MPI_INT, MPI_MIN, comm);
    free(tmp);
    return ret;
}